

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaFile.cpp
# Opt level: O0

int __thiscall Imf_3_2::RgbaOutputFile::currentScanLine(RgbaOutputFile *this)

{
  OutputFile *in_RDI;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffffd8;
  int local_4;
  
  if (in_RDI[1].super_GenericOutputFile._vptr_GenericOutputFile == (_func_int **)0x0) {
    local_4 = OutputFile::currentScanLine(in_RDI);
  }
  else {
    std::lock_guard<std::mutex>::lock_guard
              ((lock_guard<std::mutex> *)in_RDI,in_stack_ffffffffffffffd8);
    local_4 = ToYca::currentScanLine
                        ((ToYca *)in_RDI[1].super_GenericOutputFile._vptr_GenericOutputFile);
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x24bfc9);
  }
  return local_4;
}

Assistant:

int
RgbaOutputFile::currentScanLine () const
{
    if (_toYca)
    {
        std::lock_guard<std::mutex> lock (*_toYca);
        return _toYca->currentScanLine ();
    }
    else
    {
        return _outputFile->currentScanLine ();
    }
}